

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemFinalize(Mem *pMem,FuncDef *pFunc)

{
  Mem t;
  MemValue local_78;
  undefined8 uStack_70;
  char *local_68;
  char *pcStack_60;
  undefined8 local_58;
  sqlite3 *psStack_50;
  _func_void_void_ptr *local_48;
  sqlite3_context local_40;
  
  local_40.pOut = (Mem *)&local_78;
  local_40.pVdbe = (Vdbe *)0x0;
  local_40.iOp = 0;
  local_40.isError = 0;
  local_40.skipFlag = '\0';
  local_40.argc = '\0';
  local_40._42_6_ = 0;
  local_40.argv[0] = (sqlite3_value *)0x0;
  local_78.r = 0.0;
  local_68 = (char *)0x0;
  pcStack_60 = (char *)0x0;
  local_58 = 0;
  local_48 = (_func_void_void_ptr *)0x0;
  uStack_70 = 1;
  psStack_50 = pMem->db;
  local_40.pFunc = pFunc;
  local_40.pMem = pMem;
  (*pFunc->xFinalize)(&local_40);
  if (0 < pMem->szMalloc) {
    sqlite3DbFreeNN(pMem->db,pMem->zMalloc);
  }
  pMem->xDel = local_48;
  pMem->szMalloc = (undefined4)local_58;
  pMem->uTemp = local_58._4_4_;
  pMem->db = psStack_50;
  pMem->z = local_68;
  pMem->zMalloc = pcStack_60;
  (pMem->u).r = (double)local_78;
  pMem->flags = (undefined2)uStack_70;
  pMem->enc = uStack_70._2_1_;
  pMem->eSubtype = uStack_70._3_1_;
  pMem->n = uStack_70._4_4_;
  return local_40.isError;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFinalize(Mem *pMem, FuncDef *pFunc){
  sqlite3_context ctx;
  Mem t;
  assert( pFunc!=0 );
  assert( pFunc->xFinalize!=0 );
  assert( (pMem->flags & MEM_Null)!=0 || pFunc==pMem->u.pDef );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  memset(&ctx, 0, sizeof(ctx));
  memset(&t, 0, sizeof(t));
  t.flags = MEM_Null;
  t.db = pMem->db;
  ctx.pOut = &t;
  ctx.pMem = pMem;
  ctx.pFunc = pFunc;
  pFunc->xFinalize(&ctx); /* IMP: R-24505-23230 */
  assert( (pMem->flags & MEM_Dyn)==0 );
  if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
  memcpy(pMem, &t, sizeof(t));
  return ctx.isError;
}